

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O0

size_t __thiscall
andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
          (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this,size_t vertexIndex0,
          size_t vertexIndex1)

{
  bool *pbVar1;
  size_type sVar2;
  Value in_RDX;
  Value in_RSI;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_RDI;
  pair<bool,_unsigned_long> pVar3;
  pair<bool,_unsigned_long> p;
  size_t edgeIndex;
  size_t in_stack_00000028;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_00000030;
  vector<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
  *__x;
  Edge<false,_unsigned_long> local_30;
  Value local_20;
  Value local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pbVar1 = multipleEdgesEnabled(in_RDI);
  if ((*pbVar1 & 1U) == 0) {
    pVar3 = findEdge(in_stack_00000030,in_stack_00000028,edgeIndex);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return pVar3.second;
    }
  }
  __x = &in_RDI->edges_;
  detail::Edge<false,_unsigned_long>::Edge(&local_30,local_18,local_20);
  std::
  vector<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
  ::push_back((vector<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
               *)in_RDI,(value_type *)__x);
  sVar2 = std::
          vector<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
          ::size(&in_RDI->edges_);
  insertAdjacenciesForEdge
            ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)edgeIndex,p.second);
  IdleGraphVisitor<unsigned_long>::insertEdge
            ((IdleGraphVisitor<unsigned_long> *)&in_RDI->field_0x31,sVar2 - 1);
  return sVar2 - 1;
}

Assistant:

inline std::size_t
Graph<VISITOR>::insertEdge(
    const std::size_t vertexIndex0,
    const std::size_t vertexIndex1
) {
    assert(vertexIndex0 < numberOfVertices()); 
    assert(vertexIndex1 < numberOfVertices()); 
    
    if(multipleEdgesEnabled()) {
insertEdgeMark:
        edges_.push_back(Edge(vertexIndex0, vertexIndex1));
        std::size_t edgeIndex = edges_.size() - 1;
        insertAdjacenciesForEdge(edgeIndex);
        visitor_.insertEdge(edgeIndex);  
        return edgeIndex;
    }
    else {
        std::pair<bool, std::size_t> p = findEdge(vertexIndex0, vertexIndex1);
        if(p.first) { // edge already exists
            return p.second;
        }
        else {
            goto insertEdgeMark;
        }
    }
}